

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgSequenceOptimizer.cpp
# Opt level: O3

double TasGrid::Optimizer::getValue<(TasGrid::TypeOneDRule)17>
                 (CurrentNodes<(TasGrid::TypeOneDRule)17> *current,double x)

{
  double *pdVar1;
  vector<double,_std::allocator<double>_> *__range2;
  OptimizerResult OVar2;
  CurrentNodes<(TasGrid::TypeOneDRule)15> companion;
  CurrentNodes<(TasGrid::TypeOneDRule)15> local_38;
  
  pdVar1 = (current->nodes).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  while( true ) {
    if (pdVar1 == (current->nodes).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      CurrentNodes<(TasGrid::TypeOneDRule)15>::CurrentNodes(&local_38,&current->nodes,x);
      OVar2 = computeMaximum<(TasGrid::TypeOneDRule)15>(&local_38);
      if (local_38.coeff.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_38.coeff.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_38.coeff.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_38.coeff.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_38.nodes.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_38.nodes.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_38.nodes.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_38.nodes.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      return -OVar2.value;
    }
    if (ABS(x - *pdVar1) < 1e-11) break;
    pdVar1 = pdVar1 + 1;
  }
  return -1e+100;
}

Assistant:

double getValue<rule_minlebesgue>(CurrentNodes<rule_minlebesgue> const& current, double x){
    for(auto n : current.nodes) if (std::abs(x - n) < 10 * Maths::num_tol) return -1.E+100;

    CurrentNodes<rule_maxlebesgue> companion(current.nodes, x);
    return - computeMaximum(companion).value;
}